

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O3

void Abc_NtkSortCubes(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vCubes;
  void **ppvVar1;
  Vec_Str_t *vStore;
  char *__ptr;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  
  if (pNtk->ntkFunc == ABC_FUNC_SOP) {
    vCubes = (Vec_Ptr_t *)malloc(0x10);
    vCubes->nCap = 1000;
    vCubes->nSize = 0;
    ppvVar1 = (void **)malloc(8000);
    vCubes->pArray = ppvVar1;
    vStore = (Vec_Str_t *)malloc(0x10);
    vStore->nCap = 1000;
    vStore->nSize = 0;
    __ptr = (char *)malloc(1000);
    vStore->pArray = __ptr;
    pVVar2 = pNtk->vObjs;
    if (0 < pVVar2->nSize) {
      lVar3 = 0;
      do {
        pNode = (Abc_Obj_t *)pVVar2->pArray[lVar3];
        if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
          Abc_NodeSortCubes(pNode,vCubes,vStore);
          pVVar2 = pNtk->vObjs;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < pVVar2->nSize);
      __ptr = vStore->pArray;
    }
    if (__ptr != (char *)0x0) {
      free(__ptr);
    }
    free(vStore);
    if (vCubes->pArray != (void **)0x0) {
      free(vCubes->pArray);
    }
    free(vCubes);
    return;
  }
  __assert_fail("Abc_NtkHasSop(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanOrder.c"
                ,0x148,"void Abc_NtkSortCubes(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkSortCubes( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vCubes;
    Vec_Str_t * vStore;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkHasSop(pNtk) );
    vCubes = Vec_PtrAlloc( 1000 );
    vStore = Vec_StrAlloc( 1000 );
    Abc_NtkForEachNode( pNtk, pNode, i )
        Abc_NodeSortCubes( pNode, vCubes, vStore );
    Vec_StrFree( vStore );
    Vec_PtrFree( vCubes );
}